

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Action_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::IO_Action_PDU::IO_Action_PDU(IO_Action_PDU *this,Header *H,KDataStream *stream)

{
  KDataStream *stream_local;
  Header *H_local;
  IO_Action_PDU *this_local;
  
  IO_Header::IO_Header(&this->super_IO_Header,H);
  (this->super_IO_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__IO_Action_PDU_00331688;
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_RecEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_AtkEntityID);
  DATA_TYPE::EntityIdentifier::EntityIdentifier(&this->m_TgtEntityID);
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::vector(&this->m_vStdVarRecs);
  (*(this->super_IO_Header).super_Header.super_Header6._vptr_Header6[3])(this,stream,1);
  return;
}

Assistant:

IO_Action_PDU::IO_Action_PDU(const Header &H, KDataStream &stream) noexcept(false) :
    IO_Header( H )
{
    Decode( stream, true );
}